

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode DateTime_decodeBinary(UA_DateTime *dst)

{
  UA_StatusCode UVar1;
  
  UVar1 = 0x80070000;
  if (pos + 8 <= end) {
    *dst = *(UA_DateTime *)pos;
    pos = pos + 8;
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
UInt64_decodeBinary(UA_UInt64 *dst, const UA_DataType *_) {
    if(pos + sizeof(UA_UInt64) > end)
        return UA_STATUSCODE_BADDECODINGERROR;
#if UA_BINARY_OVERLAYABLE_INTEGER
    memcpy(dst, pos, sizeof(UA_UInt64));
#else
    UA_decode64(pos, dst);
#endif
    pos += 8;
    return UA_STATUSCODE_GOOD;
}